

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StructNew *curr)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  Expression **childp;
  const_reference pvVar4;
  ulong local_30;
  size_t i;
  Struct *local_20;
  FieldList *fields;
  StructNew *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  fields = (FieldList *)curr;
  curr_local = (StructNew *)this;
  bVar1 = StructNew::isWithDefault(curr);
  if (!bVar1) {
    i = (size_t)wasm::Type::getHeapType
                          ((Type *)&(fields->
                                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>).
                                    _M_impl.super__Vector_impl_data._M_finish);
    local_20 = HeapType::getStruct((HeapType *)&i);
    sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&local_20->fields);
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       &(fields->super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 != sVar3) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                    ,0x371,
                    "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew(StructNew *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                   );
    }
    for (local_30 = 0;
        sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&local_20->fields),
        local_30 < sVar2; local_30 = local_30 + 1) {
      childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                          &(fields->super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>).
                           _M_impl.super__Vector_impl_data._M_end_of_storage,local_30);
      pvVar4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                         (&local_20->fields,local_30);
      note(this,childp,(Type)(pvVar4->type).id);
    }
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (curr->isWithDefault()) {
      return;
    }
    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());
    for (size_t i = 0; i < fields.size(); ++i) {
      note(&curr->operands[i], fields[i].type);
    }
  }